

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

QList<QByteArray> * __thiscall
QTimeZonePrivate::availableTimeZoneIds
          (QList<QByteArray> *__return_storage_ptr__,QTimeZonePrivate *this,Territory territory)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QByteArray> QStack_48;
  QArrayDataPointer<QByteArrayView> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  matchingTimeZoneIds((QList<QByteArrayView> *)&local_30,this,territory);
  (*this->_vptr_QTimeZonePrivate[0x15])(&QStack_48,this);
  selectAvailable(__return_storage_ptr__,(QList<QByteArrayView> *)&local_30,
                  (QList<QByteArray> *)&QStack_48);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&QStack_48);
  QArrayDataPointer<QByteArrayView>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArray> QTimeZonePrivate::availableTimeZoneIds(QLocale::Territory territory) const
{
    return selectAvailable(matchingTimeZoneIds(territory), availableTimeZoneIds());
}